

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::draw_line
          (Image *this,ssize_t x0,ssize_t y0,ssize_t x1,ssize_t y1,uint64_t r,uint64_t g,uint64_t b,
          uint64_t a)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ssize_t sVar9;
  ssize_t y;
  long lVar10;
  double dVar11;
  double local_60;
  
  if (((((-1 < x0) && (-1 < y0)) && (x0 < this->width)) && (y0 < this->height)) ||
     (((-1 < x1 && (-1 < y1)) && ((x1 < this->width && (y1 < this->height)))))) {
    uVar2 = y1 - y0;
    uVar8 = -uVar2;
    if (0 < (long)uVar2) {
      uVar8 = uVar2;
    }
    uVar3 = x1 - x0;
    uVar2 = -uVar3;
    if (0 < (long)uVar3) {
      uVar2 = uVar3;
    }
    y = y0;
    sVar9 = y1;
    if (uVar2 < uVar8) {
      y = x0;
      x0 = y0;
      sVar9 = x1;
      x1 = y1;
    }
    lVar4 = sVar9;
    lVar10 = x1;
    if (x1 < x0) {
      lVar4 = y;
      y = sVar9;
      lVar10 = x0;
      x0 = x1;
    }
    lVar5 = lVar4 - y;
    bVar1 = y <= lVar4;
    lVar4 = -lVar5;
    if (0 < lVar5) {
      lVar4 = lVar5;
    }
    lVar6 = lVar10 - x0;
    if (x0 <= lVar10) {
      local_60 = 0.0;
      do {
        if (uVar2 < uVar8) {
          write_pixel(this,y,x0,r,g,b,a);
        }
        else {
          write_pixel(this,x0,y,r,g,b,a);
        }
        dVar11 = local_60 + (double)lVar4 / (double)lVar6;
        local_60 = dVar11 + -1.0;
        lVar7 = (ulong)(lVar5 != 0 && bVar1) * 2 + -1;
        if (dVar11 < 0.5) {
          lVar7 = 0;
          local_60 = dVar11;
        }
        y = y + lVar7;
        x0 = x0 + 1;
      } while (lVar10 + 1 != x0);
    }
  }
  return;
}

Assistant:

void Image::draw_line(ssize_t x0, ssize_t y0, ssize_t x1, ssize_t y1,
    uint64_t r, uint64_t g, uint64_t b, uint64_t a) {

  // if both endpoints are outside the image, don't bother
  if ((x0 < 0 || x0 >= width || y0 < 0 || y0 >= height) &&
      (x1 < 0 || x1 >= width || y1 < 0 || y1 >= height)) {
    return;
  }

  // line is too steep? then we step along y rather than x
  bool steep = abs(y1 - y0) > abs(x1 - x0);
  if (steep) {
    ssize_t t = x0;
    x0 = y0;
    y0 = t;
    t = x1;
    x1 = y1;
    y1 = t;
  }

  // line is backward? then switch the points
  if (x0 > x1) {
    ssize_t t = x1;
    x1 = x0;
    x0 = t;
    t = y1;
    y1 = y0;
    y0 = t;
  }

  // initialize variables for stepping along the line
  ssize_t dx = x1 - x0;
  ssize_t dy = abs(y1 - y0);
  double error = 0;
  double derror = (double)dy / (double)dx;
  ssize_t ystep = (y0 < y1) ? 1 : -1;
  ssize_t y = y0;

  // now walk along the line
  for (ssize_t x = x0; x <= x1; x++) {
    if (steep) {
      try {
        this->write_pixel(y, x, r, g, b, a);
      } catch (const out_of_range& e) {
        return;
      }
    } else {
      try {
        this->write_pixel(x, y, r, g, b, a);
      } catch (const out_of_range& e) {
        return;
      }
    }
    error += derror;

    // have we passed the center of this row? then move to the next row
    if (error >= 0.5) {
      y += ystep;
      error -= 1.0;
    }
  }
}